

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibLut.c
# Opt level: O3

void If_LibLutPrint(If_LibLut_t *pLutLib)

{
  bool bVar1;
  long lVar2;
  float (*pafVar3) [33];
  ulong uVar4;
  ulong uVar5;
  
  Abc_Print(1,"# The area/delay of k-variable LUTs:\n");
  Abc_Print(1,"# k    area     delay\n");
  if (pLutLib->fVarPinDelays == 0) {
    if (0 < pLutLib->LutMax) {
      pafVar3 = pLutLib->pLutDelays;
      uVar5 = 0;
      do {
        pafVar3 = pafVar3 + 1;
        lVar2 = uVar5 + 1;
        uVar5 = uVar5 + 1;
        Abc_Print(1,"%d   %7.2f   %7.2f\n",(double)pLutLib->pLutAreas[lVar2],(double)(*pafVar3)[0],
                  uVar5 & 0xffffffff);
      } while ((long)uVar5 < (long)pLutLib->LutMax);
    }
  }
  else if (0 < pLutLib->LutMax) {
    pafVar3 = pLutLib->pLutDelays;
    uVar5 = 1;
    do {
      pafVar3 = pafVar3 + 1;
      Abc_Print(1,"%d   %7.2f  ",(double)pLutLib->pLutAreas[uVar5],uVar5 & 0xffffffff);
      uVar4 = 0;
      do {
        Abc_Print(1," %7.2f",(double)(*pafVar3)[uVar4]);
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
      Abc_Print(1,"\n");
      bVar1 = (long)uVar5 < (long)pLutLib->LutMax;
      uVar5 = uVar5 + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void If_LibLutPrint( If_LibLut_t * pLutLib )
{
    int i, k;
    Abc_Print( 1, "# The area/delay of k-variable LUTs:\n" );
    Abc_Print( 1, "# k    area     delay\n" );
    if ( pLutLib->fVarPinDelays )
    {
        for ( i = 1; i <= pLutLib->LutMax; i++ )
        {
            Abc_Print( 1, "%d   %7.2f  ", i, pLutLib->pLutAreas[i] );
            for ( k = 0; k < i; k++ )
                Abc_Print( 1, " %7.2f", pLutLib->pLutDelays[i][k] );
            Abc_Print( 1, "\n" );
        }
    }
    else
        for ( i = 1; i <= pLutLib->LutMax; i++ )
            Abc_Print( 1, "%d   %7.2f   %7.2f\n", i, pLutLib->pLutAreas[i], pLutLib->pLutDelays[i][0] );
}